

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

UString * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::manifestJson
          (UString *__return_storage_ptr__,Interpreter *this,LocationRange *loc,bool multiline,
          UString *indent)

{
  Value *pVVar1;
  Stack *this_00;
  Type TVar2;
  HeapEntity *pHVar3;
  Interpreter *this_01;
  key_type *__k;
  _func_int **pp_Var4;
  pointer pFVar5;
  anon_union_8_3_4e909c26_for_v aVar6;
  undefined4 uVar7;
  mapped_type *ppIVar8;
  undefined8 uVar9;
  char32_t *pcVar10;
  AST *ast_;
  RuntimeError *__return_storage_ptr___00;
  bool manifesting;
  char32_t *pcVar11;
  LocationRange *pLVar12;
  _func_int **pp_Var13;
  UStringStream ss;
  UString element;
  LocationRange tloc;
  UString indent2;
  UString local_50;
  
  ss.buf._M_dataplus._M_p = (pointer)&ss.buf.field_2;
  ss.buf._M_string_length = 0;
  ss.buf.field_2._M_local_buf[0] = L'\0';
  TVar2 = (this->scratch).t;
  if (TVar2 - ARRAY < 4) {
    pVVar1 = &this->scratch;
    switch(TVar2) {
    case ARRAY:
      pHVar3 = (this->scratch).v.h;
      if (*(_func_int ***)&pHVar3[1].mark == pHVar3[1]._vptr_HeapEntity) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&ss.buf,L"[ ]");
      }
      else {
        pcVar11 = L"[";
        if (multiline) {
          pcVar11 = L"[\n";
          std::operator+(&indent2,indent,L"   ");
          pcVar10 = L",\n";
        }
        else {
          std::__cxx11::u32string::u32string((u32string *)&indent2,indent);
          pcVar10 = L", ";
        }
        pp_Var4 = *(_func_int ***)&pHVar3[1].mark;
        this_00 = &this->stack;
        for (pp_Var13 = pHVar3[1]._vptr_HeapEntity; pp_Var13 != pp_Var4; pp_Var13 = pp_Var13 + 1) {
          pHVar3 = (HeapEntity *)*pp_Var13;
          pLVar12 = (LocationRange *)(*(long *)&pHVar3[6].mark + 8);
          if (*(long *)&pHVar3[6].mark == 0) {
            pLVar12 = loc;
          }
          LocationRange::LocationRange(&tloc,pLVar12);
          if (pHVar3->field_0xa == '\x01') {
            element._M_dataplus._M_p = (pointer)0x0;
            element._M_string_length = 0;
            element.field_2._M_allocated_capacity = 0;
            element.field_2._8_8_ = &element._M_string_length;
            Stack::newCall(this_00,loc,pHVar3,(HeapObject *)0x0,0,(BindingFrame *)&element);
            std::
            map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
            ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                    *)&element);
            pFVar5 = (this->stack).stack.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar7 = *(undefined4 *)&pVVar1->field_0x4;
            aVar6 = (this->scratch).v;
            pFVar5[-1].val.t = pVVar1->t;
            *(undefined4 *)&pFVar5[-1].val.field_0x4 = uVar7;
            pFVar5[-1].val.v = aVar6;
            aVar6 = *(anon_union_8_3_4e909c26_for_v *)&pHVar3[1].mark;
            *(_func_int ***)pVVar1 = pHVar3[1]._vptr_HeapEntity;
            (this->scratch).v = aVar6;
          }
          else {
            Stack::newCall(this_00,loc,pHVar3,*(HeapObject **)&pHVar3[5].mark,
                           *(uint *)&pHVar3[6]._vptr_HeapEntity,(BindingFrame *)&pHVar3[2].mark);
            pFVar5 = (this->stack).stack.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar7 = *(undefined4 *)&pVVar1->field_0x4;
            aVar6 = (this->scratch).v;
            pFVar5[-1].val.t = pVVar1->t;
            *(undefined4 *)&pFVar5[-1].val.field_0x4 = uVar7;
            pFVar5[-1].val.v = aVar6;
            evaluate(this,*(AST **)&pHVar3[6].mark,
                     (uint)(((long)(this->stack).stack.
                                   super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->stack).stack.
                                  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 400));
          }
          manifestJson(&element,this,&tloc,multiline,&indent2);
          pFVar5 = (this->stack).stack.
                   super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar7 = *(undefined4 *)&pFVar5[-1].val.field_0x4;
          aVar6 = pFVar5[-1].val.v;
          pVVar1->t = pFVar5[-1].val.t;
          *(undefined4 *)&pVVar1->field_0x4 = uVar7;
          (this->scratch).v = aVar6;
          Stack::pop(this_00);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                    (&ss.buf,pcVar11);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                    (&ss.buf,&indent2);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                    (&ss.buf,&element);
          std::__cxx11::u32string::~u32string((u32string *)&element);
          std::__cxx11::string::~string((string *)&tloc);
          pcVar11 = pcVar10;
        }
        pcVar11 = L"";
        if (multiline) {
          pcVar11 = L"\n";
        }
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&ss.buf,pcVar11);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&ss.buf,indent);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&ss.buf,L"]");
        std::__cxx11::u32string::~u32string((u32string *)&indent2);
      }
      break;
    case FUNCTION:
      __return_storage_ptr___00 = (RuntimeError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tloc,"couldn\'t manifest function in JSON output.",
                 (allocator<char> *)&element);
      Stack::makeError(__return_storage_ptr___00,&this->stack,loc,&tloc.file);
      __cxa_throw(__return_storage_ptr___00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    case OBJECT:
      this_01 = (Interpreter *)(this->scratch).v.h;
      manifesting = multiline;
      runInvariants(this,loc,(HeapObject *)this_01);
      tloc.file.field_2._8_8_ = &tloc.file._M_string_length;
      tloc.file._M_string_length._0_4_ = 0;
      tloc.file.field_2._M_allocated_capacity = 0;
      tloc.begin.column = 0;
      tloc.begin.line = tloc.file.field_2._8_8_;
      objectFields((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                    *)&element,this_01,(HeapObject *)0x1,manifesting);
      for (uVar9 = element.field_2._8_8_; (size_type *)uVar9 != &element._M_string_length;
          uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9)) {
        __k = *(key_type **)(uVar9 + 0x20);
        ppIVar8 = std::
                  map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                                *)&tloc,__k);
        *ppIVar8 = (mapped_type)__k;
      }
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                   *)&element);
      if (tloc.begin.column == 0) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&ss.buf,L"{ }");
      }
      else {
        if (multiline) {
          std::operator+(&element,indent,L"   ");
          pcVar11 = L"{\n";
          pcVar10 = L",\n";
        }
        else {
          std::__cxx11::u32string::u32string((u32string *)&element,indent);
          pcVar11 = L"{";
          pcVar10 = L", ";
        }
        uVar9 = tloc.file.field_2._8_8_;
        while ((size_type *)uVar9 != &tloc.file._M_string_length) {
          ast_ = objectIndex(this,loc,(HeapObject *)this_01,*(Identifier **)(uVar9 + 0x40),0);
          pFVar5 = (this->stack).stack.
                   super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar7 = *(undefined4 *)&pVVar1->field_0x4;
          aVar6 = (this->scratch).v;
          pFVar5[-1].val.t = pVVar1->t;
          *(undefined4 *)&pFVar5[-1].val.field_0x4 = uVar7;
          pFVar5[-1].val.v = aVar6;
          evaluate(this,ast_,
                   (uint)(((long)(this->stack).stack.
                                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->stack).stack.
                                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 400));
          manifestJson(&indent2,this,&ast_->location,multiline,&element);
          pFVar5 = (this->stack).stack.
                   super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar7 = *(undefined4 *)&pFVar5[-1].val.field_0x4;
          aVar6 = pFVar5[-1].val.v;
          pVVar1->t = pFVar5[-1].val.t;
          *(undefined4 *)&pVVar1->field_0x4 = uVar7;
          (this->scratch).v = aVar6;
          Stack::pop(&this->stack);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                    (&ss.buf,pcVar11);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                    (&ss.buf,&element);
          jsonnet_string_unparse(&local_50,(UString *)(uVar9 + 0x20),false);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                    (&ss.buf,&local_50);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                    (&ss.buf,L": ");
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                    (&ss.buf,&indent2);
          std::__cxx11::u32string::~u32string((u32string *)&local_50);
          std::__cxx11::u32string::~u32string((u32string *)&indent2);
          uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9);
          pcVar11 = pcVar10;
        }
        pcVar11 = L"";
        if (multiline) {
          pcVar11 = L"\n";
        }
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&ss.buf,pcVar11);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&ss.buf,indent);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::append(&ss.buf,L"}");
        std::__cxx11::u32string::~u32string((u32string *)&element);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                   *)&tloc);
      break;
    case STRING:
      jsonnet_string_unparse((UString *)&tloc,(UString *)((this->scratch).v.h + 1),false);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      append(&ss.buf,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)&tloc);
      std::__cxx11::u32string::~u32string((u32string *)&tloc);
    }
  }
  else {
    if (TVar2 == NULL_TYPE) {
      pcVar11 = L"null";
    }
    else {
      if (TVar2 != BOOLEAN) {
        if (TVar2 == NUMBER) {
          jsonnet_unparse_number_abi_cxx11_((string *)&element,(internal *)this,(this->scratch).v.d)
          ;
          decode_utf8((UString *)&tloc,(string *)&element);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                    (&ss.buf,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                              *)&tloc);
          std::__cxx11::u32string::~u32string((u32string *)&tloc);
          std::__cxx11::string::~string((string *)&element);
        }
        goto LAB_00178748;
      }
      pcVar11 = L"false";
      if ((this->scratch).v.b != false) {
        pcVar11 = L"true";
      }
    }
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    append(&ss.buf,pcVar11);
  }
LAB_00178748:
  std::__cxx11::u32string::u32string((u32string *)__return_storage_ptr__,&ss.buf);
  std::__cxx11::u32string::~u32string((u32string *)&ss);
  return __return_storage_ptr__;
}

Assistant:

UString manifestJson(const LocationRange &loc, bool multiline, const UString &indent)
    {
        // Printing fields means evaluating and binding them, which can trigger
        // garbage collection.

        UStringStream ss;
        switch (scratch.t) {
            case Value::ARRAY: {
                HeapArray *arr = static_cast<HeapArray *>(scratch.v.h);
                if (arr->elements.size() == 0) {
                    ss << U"[ ]";
                } else {
                    const char32_t *prefix = multiline ? U"[\n" : U"[";
                    UString indent2 = multiline ? indent + U"   " : indent;
                    for (auto *thunk : arr->elements) {
                        LocationRange tloc = thunk->body == nullptr ? loc : thunk->body->location;
                        if (thunk->filled) {
                            stack.newCall(loc, thunk, nullptr, 0, BindingFrame{});
                            // Keep arr alive when scratch is overwritten
                            stack.top().val = scratch;
                            scratch = thunk->content;
                        } else {
                            stack.newCall(loc, thunk, thunk->self, thunk->offset, thunk->upValues);
                            // Keep arr alive when scratch is overwritten
                            stack.top().val = scratch;
                            evaluate(thunk->body, stack.size());
                        }
                        auto element = manifestJson(tloc, multiline, indent2);
                        // Restore scratch
                        scratch = stack.top().val;
                        stack.pop();
                        ss << prefix << indent2 << element;
                        prefix = multiline ? U",\n" : U", ";
                    }
                    ss << (multiline ? U"\n" : U"") << indent << U"]";
                }
            } break;

            case Value::BOOLEAN: ss << (scratch.v.b ? U"true" : U"false"); break;

            case Value::NUMBER: ss << decode_utf8(jsonnet_unparse_number(scratch.v.d)); break;

            case Value::FUNCTION:
                throw makeError(loc, "couldn't manifest function in JSON output.");

            case Value::NULL_TYPE: ss << U"null"; break;

            case Value::OBJECT: {
                auto *obj = static_cast<HeapObject *>(scratch.v.h);
                runInvariants(loc, obj);
                // Using std::map has the useful side-effect of ordering the fields
                // alphabetically.
                std::map<UString, const Identifier *> fields;
                for (const auto &f : objectFields(obj, true)) {
                    fields[f->name] = f;
                }
                if (fields.size() == 0) {
                    ss << U"{ }";
                } else {
                    UString indent2 = multiline ? indent + U"   " : indent;
                    const char32_t *prefix = multiline ? U"{\n" : U"{";
                    for (const auto &f : fields) {
                        // pushes FRAME_CALL
                        const AST *body = objectIndex(loc, obj, f.second, 0);
                        stack.top().val = scratch;
                        evaluate(body, stack.size());
                        auto vstr = manifestJson(body->location, multiline, indent2);
                        // Reset scratch so that the object we're manifesting doesn't
                        // get GC'd.
                        scratch = stack.top().val;
                        stack.pop();
                        ss << prefix << indent2 << jsonnet_string_unparse(f.first, false) << U": "
                           << vstr;
                        prefix = multiline ? U",\n" : U", ";
                    }
                    ss << (multiline ? U"\n" : U"") << indent << U"}";
                }
            } break;

            case Value::STRING: {
                const UString &str = static_cast<HeapString *>(scratch.v.h)->value;
                ss << jsonnet_string_unparse(str, false);
            } break;
        }
        return ss.str();
    }